

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O3

Interface * QStringConverterICU::make_icu_converter(State *state,char *name)

{
  byte bVar1;
  UConverter *pUVar2;
  undefined8 uVar3;
  void *pvVar4;
  Interface *pIVar5;
  long in_FS_OFFSET;
  UErrorCode status;
  QMessageLogger local_58;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = 0;
  pUVar2 = createConverterForName(name,state);
  if (pUVar2 == (UConverter *)0x0) {
    pIVar5 = (Interface *)0x0;
  }
  else {
    uVar3 = ucnv_getName_70(pUVar2,&local_34);
    pvVar4 = (void *)ucnv_getStandardName_70(uVar3,"MIME",&local_34);
    if (0 < local_34 || pvVar4 == (void *)0x0) {
      local_34 = 0;
      pvVar4 = (void *)ucnv_getStandardName_70(uVar3,"IANA");
    }
    (state->field_4).d[1] = pvVar4;
    (state->field_4).d[0] = pUVar2;
    *(byte *)&(state->flags).super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
              super_QFlagsStorage<QStringConverterBase::Flag>.i =
         (byte)(state->flags).super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
               super_QFlagsStorage<QStringConverterBase::Flag>.i | 0x10;
    bVar1 = ucnv_getMaxCharSize_70(pUVar2);
    state->clearFn = clear_function;
    if ((byte)(bVar1 - 9) < 0xf8) {
      local_58.context.version = 2;
      local_58.context._4_8_ = 0;
      local_58.context._12_8_ = 0;
      local_58.context.function._4_4_ = 0;
      local_58.context.category = "default";
      pIVar5 = (Interface *)0x0;
      QMessageLogger::warning
                (&local_58,"Encountered unexpected codec \"%s\" which requires >8x space",name);
    }
    else {
      pIVar5 = (Interface *)&QStringConverter::encodingInterfaces[(ulong)bVar1 + 8].toUtf16;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pIVar5;
  }
  __stack_chk_fail();
}

Assistant:

static const QStringConverter::Interface *make_icu_converter(
            QStringConverter::State *state,
            const char *name)
    {
        QT_COM_THREAD_INIT
        UErrorCode status = U_ZERO_ERROR;
        UConverter *conv = createConverterForName(name, state);
        if (!conv)
            return nullptr;

        const char *icuName = ucnv_getName(conv, &status);
        // ucnv_getStandardName returns a name which is owned by the library
        // we can thus store it in the state without worrying aobut its lifetime
        const char *persistentName = ucnv_getStandardName(icuName, "MIME", &status);
        if (U_FAILURE(status) || !persistentName) {
             status = U_ZERO_ERROR;
             persistentName = ucnv_getStandardName(icuName, "IANA", &status);
        }
        state->d[1] = const_cast<char *>(persistentName);
        state->d[0] = conv;
        state->flags |= QStringConverter::Flag::UsesIcu;
        qsizetype maxCharSize = ucnv_getMaxCharSize(conv);
        state->clearFn = QStringConverterICU::clear_function;
        if (maxCharSize > 8 || maxCharSize < 1) {
            qWarning("Encountered unexpected codec \"%s\" which requires >8x space", name);
            return nullptr;
        } else {
            return &forLength[maxCharSize - 1];
        }

    }